

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spec.h
# Opt level: O3

void __thiscall bandit::reporter::spec::it_starting(spec *this,string *desc)

{
  int *piVar1;
  ostream *poVar2;
  long *local_48;
  long local_40;
  long local_38 [2];
  
  piVar1 = &(this->super_colored_base).super_progress_base.specs_run_;
  *piVar1 = *piVar1 + 1;
  poVar2 = (this->super_colored_base).stm_;
  local_48 = local_38;
  std::__cxx11::string::_M_construct((ulong)&local_48,(char)this->indentation_);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_48,local_40);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"- it ",5);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(desc->_M_dataplus)._M_p,desc->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ... ",5);
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  std::ostream::flush();
  return;
}

Assistant:

void it_starting(const std::string& desc) override {
        progress_base::it_starting(desc);
        stm_ << indent() << "- it " << desc << " ... ";
        stm_.flush();
      }